

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

void __thiscall
tchecker::clock_updates_visitor_t::update_int_to_clock_inside_loop
          (clock_updates_visitor_t *this,typed_lvalue_expression_t *x,
          shared_ptr<const_tchecker::expression_t> *c)

{
  bool bVar1;
  element_type *expr;
  uint *puVar2;
  clock_updates_list_t *pcVar3;
  clock_id_t local_58;
  clock_id_t z_1;
  clock_id_t local_44;
  undefined1 local_40 [4];
  clock_id_t z;
  clock_update_t x_upd;
  range_t<unsigned_int,_unsigned_int> x_instances;
  shared_ptr<const_tchecker::expression_t> *c_local;
  typed_lvalue_expression_t *x_local;
  clock_updates_visitor_t *this_local;
  
  x_upd._value.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extract_lvalue_variable_ids(x)
  ;
  expr = std::
         __shared_ptr_access<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)c);
  bVar1 = has_const_value(expr);
  if (bVar1) {
    clock_update_t::clock_update_t((clock_update_t *)local_40,0x7fffffff,c);
    puVar2 = range_t<unsigned_int,_unsigned_int>::begin
                       ((range_t<unsigned_int,_unsigned_int> *)
                        &x_upd._value.
                         super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
    for (local_44 = *puVar2;
        puVar2 = range_t<unsigned_int,_unsigned_int>::end
                           ((range_t<unsigned_int,_unsigned_int> *)
                            &x_upd._value.
                             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount), local_44 != *puVar2; local_44 = local_44 + 1) {
      pcVar3 = clock_updates_map_t::operator[](&this->_u,local_44);
      clock_updates_list_t::absorbing_push_back(pcVar3,(clock_update_t *)local_40);
    }
    clock_update_t::~clock_update_t((clock_update_t *)local_40);
  }
  else {
    puVar2 = range_t<unsigned_int,_unsigned_int>::begin
                       ((range_t<unsigned_int,_unsigned_int> *)
                        &x_upd._value.
                         super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
    for (local_58 = *puVar2;
        puVar2 = range_t<unsigned_int,_unsigned_int>::end
                           ((range_t<unsigned_int,_unsigned_int> *)
                            &x_upd._value.
                             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount), local_58 != *puVar2; local_58 = local_58 + 1) {
      pcVar3 = clock_updates_map_t::operator[](&this->_u,local_58);
      clock_updates_list_t::clear(pcVar3);
    }
  }
  return;
}

Assistant:

void update_int_to_clock_inside_loop(tchecker::typed_lvalue_expression_t const & x,
                                       std::shared_ptr<tchecker::expression_t const> const & c)
  {
    tchecker::range_t<tchecker::variable_id_t> x_instances = tchecker::extract_lvalue_variable_ids(x);
    if (tchecker::has_const_value(*c)) {
      tchecker::clock_update_t x_upd{tchecker::REFCLOCK_ID, c};
      for (tchecker::clock_id_t z = x_instances.begin(); z != x_instances.end(); ++z)
        _u[z].absorbing_push_back(x_upd);
    }
    else {
      for (tchecker::clock_id_t z = x_instances.begin(); z != x_instances.end(); ++z)
        _u[z].clear();
    }
  }